

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  byte bVar1;
  uint uVar2;
  ImGuiSortDirection IVar3;
  ImGuiTableColumn *in_RDI;
  int n;
  int local_14;
  ImGuiSortDirection local_4;
  
  if (in_RDI->SortOrder == -1) {
    local_4 = TableGetColumnAvailSortDirection(in_RDI,0);
  }
  else {
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      bVar1 = in_RDI->field_0x65;
      uVar2 = TableGetColumnAvailSortDirection(in_RDI,local_14);
      if ((bVar1 & 3) == uVar2) {
        IVar3 = TableGetColumnAvailSortDirection
                          (in_RDI,(local_14 + 1) % (int)(uint)((byte)in_RDI->field_0x65 >> 2 & 3));
        return IVar3;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}